

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckDecimal(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  char *pcStack_28;
  Bool hasPoint;
  tmbstr p;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pcStack_28 = attval->value;
  if ((*pcStack_28 == '+') || (*pcStack_28 == '-')) {
    pcStack_28 = pcStack_28 + 1;
  }
  while( true ) {
    if (*pcStack_28 == '\0') {
      return;
    }
    if (*pcStack_28 == '.') break;
    BVar1 = prvTidyIsDigit((int)*pcStack_28);
    if (BVar1 == no) {
      prvTidyReportAttrError(doc,node,attval,0x22b);
      return;
    }
    pcStack_28 = pcStack_28 + 1;
  }
  return;
}

Assistant:

static void CheckDecimal( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    Bool hasPoint = no;

    p  = attval->value;

    /* Allow leading sign */
    if (*p == '+' || *p == '-')
        ++p;

    while (*p)
    {
        /* Allow a single decimal point */
        if (*p == '.')
        {
            if (!hasPoint)
                hasPoint = yes;
            else
                TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
                break;
        }
        
        if (!TY_(IsDigit)(*p))
        {
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
            break;
        }
        ++p;
    }
}